

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall
QListWidget::setSelectionModel(QListWidget *this,QItemSelectionModel *selectionModel)

{
  bool bVar1;
  QListWidgetPrivate *sender;
  Object *sender_00;
  Object *context;
  offset_in_QItemSelectionModel_to_subr in_RDI;
  long in_FS_OFFSET;
  Connection *connection;
  iterator __end1;
  iterator __begin1;
  array<QMetaObject::Connection,_2UL> *__range1;
  QListWidgetPrivate *d;
  array<QMetaObject::Connection,_2UL> *in_stack_ffffffffffffff58;
  array<QMetaObject::Connection,_2UL> *this_00;
  Object *in_stack_ffffffffffffff90;
  Object *pOVar2;
  Object *receiverPrivate;
  QItemSelectionModel *in_stack_ffffffffffffffd0;
  QAbstractItemView *in_stack_ffffffffffffffd8;
  ConnectionType type;
  array<QMetaObject::Connection,_2UL> local_10;
  
  local_10._M_elems[1].d_ptr = *(void **)(in_FS_OFFSET + 0x28);
  sender = d_func((QListWidget *)0x89d8a5);
  receiverPrivate = (Object *)&sender->selectionModelConnections;
  sender_00 = (Object *)
              std::array<QMetaObject::Connection,_2UL>::begin
                        ((array<QMetaObject::Connection,_2UL> *)0x89d8d3);
  context = (Object *)
            std::array<QMetaObject::Connection,_2UL>::end
                      ((array<QMetaObject::Connection,_2UL> *)0x89d8e2);
  while (sender_00 != context) {
    pOVar2 = sender_00;
    QObject::disconnect((Connection *)sender_00);
    in_stack_ffffffffffffff90 = sender_00;
    sender_00 = pOVar2 + 8;
  }
  QAbstractItemView::setSelectionModel(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x89d946);
  if (bVar1) {
    ::QPointer::operator_cast_to_QItemSelectionModel_((QPointer<QItemSelectionModel> *)0x89d960);
    type = AutoConnection;
    QObjectPrivate::
    connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QListWidgetPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
              ((Object *)sender,0,receiverPrivate,(Function)in_stack_ffffffffffffffd0,
               (ConnectionType)((ulong)sender_00 >> 0x20));
    this_00 = &local_10;
    ::QPointer::operator_cast_to_QItemSelectionModel_((QPointer<QItemSelectionModel> *)0x89d9de);
    QObject::
    connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QListWidget::*)()>
              (sender_00,in_RDI,(ContextType *)context,
               (offset_in_QListWidget_to_subr *)in_stack_ffffffffffffff90,type);
    std::array<QMetaObject::Connection,_2UL>::operator=(this_00,in_stack_ffffffffffffff58);
    std::array<QMetaObject::Connection,_2UL>::~array(this_00);
  }
  if (*(void **)(in_FS_OFFSET + 0x28) != local_10._M_elems[1].d_ptr) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListWidget::setSelectionModel(QItemSelectionModel *selectionModel)
{
    Q_D(QListWidget);

    for (const QMetaObject::Connection &connection : d->selectionModelConnections)
        disconnect(connection);

    QListView::setSelectionModel(selectionModel);

    if (d->selectionModel) {
        d->selectionModelConnections = {
            QObjectPrivate::connect(d->selectionModel, &QItemSelectionModel::currentChanged,
                                    d, &QListWidgetPrivate::emitCurrentItemChanged),
            QObject::connect(d->selectionModel, &QItemSelectionModel::selectionChanged,
                             this, &QListWidget::itemSelectionChanged)
        };
    }
}